

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall IntegerTokenizerRule::~IntegerTokenizerRule(IntegerTokenizerRule *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    std::size_t i = 0;

    if (reader->charAt(i) == '0') {
      return std::make_pair(true, 1);
    }

    if ('1' <= reader->charAt(i) && reader->charAt(i) <= '9') {
      i++;
      while (isNumeric(reader->charAt(i))) {
        i++;
      }

      return std::make_pair(true, i);
    }

    return std::make_pair(false, 0);
  }